

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O3

bool __thiscall GraphViewer::addNode(GraphViewer *this,int id,int x,int y)

{
  Connection *this_00;
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  string str;
  char buff [200];
  string local_138;
  long *local_118;
  long local_110;
  long local_108 [2];
  char local_f8 [208];
  
  if (this->isDynamic == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "This graph is dynamic, so the provided x and y values for the node with id ",0x4b);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,id);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," will be ignored",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  sprintf(local_f8,"addNode3 %d %d %d\n",(ulong)(uint)id,(ulong)(uint)x,(ulong)(uint)y);
  local_118 = local_108;
  sVar3 = strlen(local_f8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,local_f8,local_f8 + sVar3);
  this_00 = this->con;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,local_118,local_110 + (long)local_118);
  bVar1 = Connection::sendMsg(this_00,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  return bVar1;
}

Assistant:

bool GraphViewer::addNode(int id, int x, int y) {
	if(isDynamic) {
		cerr << "This graph is dynamic, "
				"so the provided x and y values for the node with id "
				<< id << " will be ignored" << endl;
	}

	char buff[200];
	sprintf(buff, "addNode3 %d %d %d\n", id, x, y);
	string str(buff);
	return con->sendMsg(str);
}